

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void slang::ast::LocalAssertionVarSymbol::fromSyntax
               (Scope *scope,LocalVariableDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::LocalAssertionVarSymbol_*> *results)

{
  Token *this;
  undefined1 *puVar1;
  DeclaratorSyntax *decl;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  Scope *pSVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  ValueSymbol *this_00;
  ulong uVar4;
  long lVar5;
  LocalAssertionVarSymbol *var;
  string_view local_58;
  Scope *local_48;
  Compilation *local_40;
  SourceLocation local_38;
  
  uVar4 = (syntax->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < uVar4) {
    local_40 = scope->compilation;
    uVar4 = uVar4 >> 1;
    lVar5 = 0;
    local_48 = scope;
    do {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->declarators).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar5));
      decl = (DeclaratorSyntax *)*ppSVar3;
      this = &decl->name;
      local_58 = parsing::Token::valueText(this);
      local_38 = parsing::Token::location(this);
      this_00 = (ValueSymbol *)
                BumpAllocator::
                emplace<slang::ast::LocalAssertionVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                          (&local_40->super_BumpAllocator,&local_58,&local_38);
      local_58._M_len = (size_t)this_00;
      (this_00->declaredType).typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
      puVar1 = &(this_00->declaredType).field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      ValueSymbol::setFromDeclarator(this_00,decl);
      pSVar2 = local_48;
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)local_58._M_len,local_48,syntax_00);
      SmallVectorBase<slang::ast::LocalAssertionVarSymbol_const*>::
      emplace_back<slang::ast::LocalAssertionVarSymbol_const*const&>
                ((SmallVectorBase<slang::ast::LocalAssertionVarSymbol_const*> *)results,
                 (LocalAssertionVarSymbol **)&local_58);
      *(Scope **)(local_58._M_len + 0x20) = pSVar2;
      lVar5 = lVar5 + 0x30;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void LocalAssertionVarSymbol::fromSyntax(const Scope& scope,
                                         const LocalVariableDeclarationSyntax& syntax,
                                         SmallVectorBase<const LocalAssertionVarSymbol*>& results) {
    auto& comp = scope.getCompilation();
    for (auto declarator : syntax.declarators) {
        auto var = comp.emplace<LocalAssertionVarSymbol>(declarator->name.valueText(),
                                                         declarator->name.location());
        var->setDeclaredType(*syntax.type);
        var->setFromDeclarator(*declarator);
        var->setAttributes(scope, syntax.attributes);
        results.push_back(var);

        // Local variables don't get added to any scope as members but
        // we still need a parent pointer set so they can participate in lookups.
        var->setParent(scope);
    }
}